

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

long __thiscall CVmObjString::cast_to_int(CVmObjString *this)

{
  ushort *puVar1;
  vm_val_t val;
  
  puVar1 = (ushort *)(this->super_CVmObject).ext_;
  parse_num_val(&val,(char *)(puVar1 + 1),(ulong)*puVar1,10,1);
  return (long)val.val.intval;
}

Assistant:

long CVmObjString::cast_to_int(VMG0_) const
{
    /* 
     *   parse the string as an integer in decimal format; this is an
     *   explicit int cast, so don't allow BigNumber promotions 
     */
    vm_val_t val;
    parse_num_val(vmg_ &val, ext_ + VMB_LEN, vmb_get_len(ext_), 10, TRUE);

    /* return the integer value */
    return val.val.intval;
}